

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O3

void __thiscall Lodtalk::StackInterpreter::interpret(StackInterpreter *this)

{
  uint8_t **ppuVar1;
  byte bVar2;
  char cVar3;
  long *plVar4;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar5;
  uint64_t uVar6;
  int64_t iVar7;
  uint uVar8;
  long lVar9;
  uint8_t *puVar10;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar11;
  uint8_t *puVar12;
  ulong uVar13;
  StackMemory *pSVar14;
  undefined8 *puVar15;
  CompiledMethod *pCVar16;
  size_t sVar17;
  SpecialMessageSelector SVar18;
  int iVar19;
  undefined8 uVar20;
  long lVar21;
  uint8_t *puVar22;
  VMContext *pVVar23;
  bool bVar24;
  
  this->extendA = 0;
  this->extendB = 0;
  sVar17 = this->pc;
joined_r0x00144756:
  if (sVar17 == 0) {
    return;
  }
  this->currentOpcode = this->nextOpcode;
  switch(this->nextOpcode) {
  case 0:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    lVar9 = *(long *)(*(long *)((pSVar14->stackFrame).framePointer + -0x20) + 8);
    goto LAB_001460cc;
  case 1:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 8);
    goto LAB_001460cc;
  case 2:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x10);
    goto LAB_001460cc;
  case 3:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x18);
    goto LAB_001460cc;
  case 4:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x20);
    goto LAB_001460cc;
  case 5:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x28);
    goto LAB_001460cc;
  case 6:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x30);
    goto LAB_001460cc;
  case 7:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x38);
    goto LAB_001460cc;
  case 8:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x40);
    goto LAB_001460cc;
  case 9:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x48);
    goto LAB_001460cc;
  case 10:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x50);
    goto LAB_001460cc;
  case 0xb:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x58);
    goto LAB_001460cc;
  case 0xc:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x60);
    goto LAB_001460cc;
  case 0xd:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x68);
    goto LAB_001460cc;
  case 0xe:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x70);
    goto LAB_001460cc;
  case 0xf:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    lVar9 = *(long *)(lVar9 + 0x78);
    goto LAB_001460cc;
  case 0x10:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)(this->literalArray->field_0).uintValue;
    goto LAB_00146435;
  case 0x11:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[1].field_0.uintValue;
    goto LAB_00146435;
  case 0x12:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[2].field_0.uintValue;
    goto LAB_00146435;
  case 0x13:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[3].field_0.uintValue;
    goto LAB_00146435;
  case 0x14:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[4].field_0.uintValue;
    goto LAB_00146435;
  case 0x15:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[5].field_0.uintValue;
    goto LAB_00146435;
  case 0x16:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[6].field_0.uintValue;
    goto LAB_00146435;
  case 0x17:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[7].field_0.uintValue;
    goto LAB_00146435;
  case 0x18:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[8].field_0.uintValue;
    goto LAB_00146435;
  case 0x19:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[9].field_0.uintValue;
    goto LAB_00146435;
  case 0x1a:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[10].field_0.uintValue;
    goto LAB_00146435;
  case 0x1b:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xb].field_0.uintValue;
    goto LAB_00146435;
  case 0x1c:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xc].field_0.uintValue;
    goto LAB_00146435;
  case 0x1d:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xd].field_0.uintValue;
    goto LAB_00146435;
  case 0x1e:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xe].field_0.uintValue;
    goto LAB_00146435;
  case 0x1f:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray[0xf].field_0.uintValue;
    goto LAB_00146435;
  case 0x20:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray->field_0;
    goto LAB_00146439;
  case 0x21:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[1].field_0;
    goto LAB_00146439;
  case 0x22:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)this->literalArray;
LAB_00146435:
    aVar11 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)(aVar11.uintValue + 0x10);
    goto LAB_00146439;
  case 0x23:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[3].field_0;
    goto LAB_00146439;
  case 0x24:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[4].field_0;
    goto LAB_00146439;
  case 0x25:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[5].field_0;
    goto LAB_00146439;
  case 0x26:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[6].field_0;
    goto LAB_00146439;
  case 0x27:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[7].field_0;
    goto LAB_00146439;
  case 0x28:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[8].field_0;
    goto LAB_00146439;
  case 0x29:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[9].field_0;
    goto LAB_00146439;
  case 0x2a:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[10].field_0;
    goto LAB_00146439;
  case 0x2b:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0xb].field_0;
    goto LAB_00146439;
  case 0x2c:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0xc].field_0;
    goto LAB_00146439;
  case 0x2d:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0xd].field_0;
    goto LAB_00146439;
  case 0x2e:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0xe].field_0;
    goto LAB_00146439;
  case 0x2f:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0xf].field_0;
    goto LAB_00146439;
  case 0x30:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x10].field_0;
    goto LAB_00146439;
  case 0x31:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x11].field_0;
    goto LAB_00146439;
  case 0x32:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x12].field_0;
    goto LAB_00146439;
  case 0x33:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x13].field_0;
    goto LAB_00146439;
  case 0x34:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x14].field_0;
    goto LAB_00146439;
  case 0x35:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x15].field_0;
    goto LAB_00146439;
  case 0x36:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x16].field_0;
    goto LAB_00146439;
  case 0x37:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x17].field_0;
    goto LAB_00146439;
  case 0x38:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x18].field_0;
    goto LAB_00146439;
  case 0x39:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x19].field_0;
    goto LAB_00146439;
  case 0x3a:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x1a].field_0;
    goto LAB_00146439;
  case 0x3b:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x1b].field_0;
    goto LAB_00146439;
  case 0x3c:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x1c].field_0;
    goto LAB_00146439;
  case 0x3d:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x1d].field_0;
    goto LAB_00146439;
  case 0x3e:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x1e].field_0;
    goto LAB_00146439;
  case 0x3f:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    aVar11 = this->literalArray[0x1f].field_0;
LAB_00146439:
    puVar12 = (pSVar14->stackFrame).stackPointer;
    (pSVar14->stackFrame).stackPointer = puVar12 + -8;
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar12 + -8) = aVar11;
    break;
  case 0x40:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    sVar17 = this->argumentCount;
    puVar12 = (pSVar14->stackFrame).framePointer;
    puVar10 = (pSVar14->stackFrame).stackPointer;
    puVar22 = puVar12 + 0x10;
    if (sVar17 == 0) {
      puVar22 = puVar12 + -0x28;
    }
    uVar20 = *(undefined8 *)(puVar22 + (sVar17 - (sVar17 != 0)) * 8);
    (pSVar14->stackFrame).stackPointer = puVar10 + -8;
    *(undefined8 *)(puVar10 + -8) = uVar20;
    break;
  case 0x41:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffe;
    lVar21 = 0x1fffffffffffffff;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 2;
    goto LAB_001460b9;
  case 0x42:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffd;
    lVar21 = 0x1ffffffffffffffe;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 3;
    goto LAB_001460b9;
  case 0x43:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffc;
    lVar21 = 0x1ffffffffffffffd;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 4;
    goto LAB_001460b9;
  case 0x44:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffb;
    lVar21 = 0x1ffffffffffffffc;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 5;
    goto LAB_001460b9;
  case 0x45:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffa;
    lVar21 = 0x1ffffffffffffffb;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 6;
    goto LAB_001460b9;
  case 0x46:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffa;
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 7;
    if (!bVar24) {
      lVar9 = 0x1ffffffffffffff9;
    }
    goto LAB_0014627f;
  case 0x47:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffff8;
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 8;
    if (bVar24) {
      lVar9 = 0x1ffffffffffffff9;
    }
LAB_0014627f:
    puVar22 = (pSVar14->stackFrame).stackPointer;
    if (bVar24) {
      puVar10 = puVar12;
    }
    uVar20 = *(undefined8 *)(puVar10 + (lVar9 + uVar13) * 8);
    (pSVar14->stackFrame).stackPointer = puVar22 + -8;
    *(undefined8 *)(puVar22 + -8) = uVar20;
    break;
  case 0x48:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffff7;
    lVar21 = 0x1ffffffffffffff8;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 9;
    goto LAB_001460b9;
  case 0x49:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffff6;
    lVar21 = 0x1ffffffffffffff7;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 10;
    goto LAB_001460b9;
  case 0x4a:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffff5;
    lVar21 = 0x1ffffffffffffff6;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 0xb;
    goto LAB_001460b9;
  case 0x4b:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffff4;
    lVar21 = 0x1ffffffffffffff5;
    puVar22 = (pSVar14->stackFrame).framePointer;
    puVar10 = puVar22 + -0x28;
    puVar22 = puVar22 + 0x10;
    bVar24 = uVar13 < 0xc;
LAB_001460b9:
    if (!bVar24) {
      lVar21 = lVar9;
    }
    puVar12 = (pSVar14->stackFrame).stackPointer;
    if (bVar24) {
      puVar22 = puVar10;
    }
    lVar9 = *(long *)(puVar22 + (lVar21 + uVar13) * 8);
    goto LAB_001460cc;
  case 0x4c:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    lVar9 = *(long *)((pSVar14->stackFrame).framePointer + -0x20);
    goto LAB_001460cc;
  case 0x4d:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar12 + -8;
    puVar15 = &TrueObject;
    goto LAB_00146243;
  case 0x4e:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar12 + -8;
    puVar15 = &FalseObject;
    goto LAB_00146243;
  case 0x4f:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar12 + -8;
    puVar15 = &NilObject;
LAB_00146243:
    *(undefined8 **)(puVar12 + -8) = puVar15;
    break;
  case 0x50:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar12 + -8;
    puVar12[-8] = '\x01';
    puVar12[-7] = '\0';
    puVar12[-6] = '\0';
    puVar12[-5] = '\0';
    puVar12[-4] = '\0';
    puVar12[-3] = '\0';
    puVar12[-2] = '\0';
    puVar12[-1] = '\0';
    break;
  case 0x51:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (this->stack->stackFrame).stackPointer;
    (this->stack->stackFrame).stackPointer = puVar12 + -8;
    puVar12[-8] = '\x03';
    puVar12[-7] = '\0';
    puVar12[-6] = '\0';
    puVar12[-5] = '\0';
    puVar12[-4] = '\0';
    puVar12[-3] = '\0';
    puVar12[-2] = '\0';
    puVar12[-1] = '\0';
    break;
  case 0x52:
    interpretPushThisContext(this);
    break;
  case 0x53:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (this->stack->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (this->stack->stackFrame).stackPointer = puVar12 + -8;
    *(undefined8 *)(puVar12 + -8) = uVar20;
    break;
  default:
    errorFormat(this,"unsupported bytecode %d");
    break;
  case 0x58:
    aVar11 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)((this->stack->stackFrame).framePointer + -0x20);
    goto LAB_00146108;
  case 0x59:
    aVar11.pointer = (uint8_t *)&TrueObject;
    goto LAB_00146108;
  case 0x5a:
    aVar11.pointer = (uint8_t *)&FalseObject;
    goto LAB_00146108;
  case 0x5b:
    aVar11.pointer = (uint8_t *)&NilObject;
    goto LAB_00146108;
  case 0x5c:
    paVar5 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
    aVar11 = *paVar5;
    (this->stack->stackFrame).stackPointer = (uint8_t *)(paVar5 + 1);
LAB_00146108:
    returnValue(this,(Oop)aVar11);
    break;
  case 0x5d:
    aVar11.pointer = (uint8_t *)&NilObject;
    goto LAB_001454ef;
  case 0x5e:
    paVar5 = (anon_union_8_4_0eb573b0_for_Oop_0 *)(this->stack->stackFrame).stackPointer;
    aVar11 = *paVar5;
    (this->stack->stackFrame).stackPointer = (uint8_t *)(paVar5 + 1);
LAB_001454ef:
    localReturnValue(this,(Oop)aVar11);
    break;
  case 0x5f:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    sVar17 = sVar17 + 1;
    goto joined_r0x00144756;
  case 0x60:
    interpretSpecialMessageAdd(this);
    break;
  case 0x61:
    interpretSpecialMessageMinus(this);
    break;
  case 0x62:
    interpretSpecialMessageLessThan(this);
    break;
  case 99:
    interpretSpecialMessageGreaterThan(this);
    break;
  case 100:
    interpretSpecialMessageLessEqual(this);
    break;
  case 0x65:
    interpretSpecialMessageGreaterEqual(this);
    break;
  case 0x66:
    interpretSpecialMessageEqual(this);
    break;
  case 0x67:
    interpretSpecialMessageNotEqual(this);
    break;
  case 0x68:
    interpretSpecialMessageMultiply(this);
    break;
  case 0x69:
    interpretSpecialMessageDivide(this);
    break;
  case 0x6a:
    interpretSpecialMessageRemainder(this);
    break;
  case 0x6b:
    pVVar23 = this->context;
    SVar18 = MakePoint;
    goto LAB_00145ed7;
  case 0x6c:
    interpretSpecialMessageBitShift(this);
    break;
  case 0x6d:
    interpretSpecialMessageIntegerDivision(this);
    break;
  case 0x6e:
    interpretSpecialMessageBitAnd(this);
    break;
  case 0x6f:
    interpretSpecialMessageBitOr(this);
    break;
  case 0x70:
    pVVar23 = this->context;
    SVar18 = At;
    goto LAB_00145ed7;
  case 0x71:
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)
             VMContext::getSpecialMessageSelector(this->context,AtPut);
    sVar17 = 2;
    goto LAB_00145ffc;
  case 0x72:
    pVVar23 = this->context;
    SVar18 = Size;
    goto LAB_00145fef;
  case 0x73:
    pVVar23 = this->context;
    SVar18 = Next;
    goto LAB_00145fef;
  case 0x74:
    pVVar23 = this->context;
    SVar18 = NextPut;
    goto LAB_00145ed7;
  case 0x75:
    pVVar23 = this->context;
    SVar18 = AtEnd;
    goto LAB_00145fef;
  case 0x76:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    plVar4 = (long *)(this->stack->stackFrame).stackPointer;
    lVar9 = *plVar4;
    (this->stack->stackFrame).stackPointer = (uint8_t *)(plVar4 + 1);
    if (plVar4[1] == lVar9) {
      puVar15 = &TrueObject;
    }
    else {
      puVar15 = &FalseObject;
    }
    plVar4[1] = (long)puVar15;
    break;
  case 0x77:
    interpretSpecialMessageClass(this);
    break;
  case 0x79:
    pVVar23 = this->context;
    SVar18 = Value;
    goto LAB_00145fef;
  case 0x7a:
    pVVar23 = this->context;
    SVar18 = ValueArg;
    goto LAB_00145ed7;
  case 0x7b:
    pVVar23 = this->context;
    SVar18 = Do;
    goto LAB_00145ed7;
  case 0x7c:
    pVVar23 = this->context;
    SVar18 = New;
    goto LAB_00145fef;
  case 0x7d:
    pVVar23 = this->context;
    SVar18 = NewArray;
LAB_00145ed7:
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::getSpecialMessageSelector(pVVar23,SVar18)
    ;
    sVar17 = 1;
    goto LAB_00145ffc;
  case 0x7e:
    pVVar23 = this->context;
    SVar18 = X;
    goto LAB_00145fef;
  case 0x7f:
    pVVar23 = this->context;
    SVar18 = Y;
LAB_00145fef:
    aVar11 = (anon_union_8_4_0eb573b0_for_Oop_0)VMContext::getSpecialMessageSelector(pVVar23,SVar18)
    ;
    goto LAB_00145ffa;
  case 0x80:
    aVar11 = this->literalArray->field_0;
    goto LAB_00145ffa;
  case 0x81:
    aVar11 = this->literalArray[1].field_0;
    goto LAB_00145ffa;
  case 0x82:
    aVar11 = this->literalArray[2].field_0;
    goto LAB_00145ffa;
  case 0x83:
    aVar11 = this->literalArray[3].field_0;
    goto LAB_00145ffa;
  case 0x84:
    aVar11 = this->literalArray[4].field_0;
    goto LAB_00145ffa;
  case 0x85:
    aVar11 = this->literalArray[5].field_0;
    goto LAB_00145ffa;
  case 0x86:
    aVar11 = this->literalArray[6].field_0;
    goto LAB_00145ffa;
  case 0x87:
    aVar11 = this->literalArray[7].field_0;
    goto LAB_00145ffa;
  case 0x88:
    aVar11 = this->literalArray[8].field_0;
    goto LAB_00145ffa;
  case 0x89:
    aVar11 = this->literalArray[9].field_0;
    goto LAB_00145ffa;
  case 0x8a:
    aVar11 = this->literalArray[10].field_0;
    goto LAB_00145ffa;
  case 0x8b:
    aVar11 = this->literalArray[0xb].field_0;
    goto LAB_00145ffa;
  case 0x8c:
    aVar11 = this->literalArray[0xc].field_0;
    goto LAB_00145ffa;
  case 0x8d:
    aVar11 = this->literalArray[0xd].field_0;
    goto LAB_00145ffa;
  case 0x8e:
    aVar11 = this->literalArray[0xe].field_0;
    goto LAB_00145ffa;
  case 0x8f:
    aVar11 = this->literalArray[0xf].field_0;
LAB_00145ffa:
    sVar17 = 0;
LAB_00145ffc:
    sendSelectorArgumentCount(this,(Oop)aVar11,sVar17,false);
    break;
  case 0x90:
    aVar11 = this->literalArray->field_0;
    goto LAB_00145fd3;
  case 0x91:
    aVar11 = this->literalArray[1].field_0;
    goto LAB_00145fd3;
  case 0x92:
    aVar11 = this->literalArray[2].field_0;
    goto LAB_00145fd3;
  case 0x93:
    aVar11 = this->literalArray[3].field_0;
    goto LAB_00145fd3;
  case 0x94:
    aVar11 = this->literalArray[4].field_0;
    goto LAB_00145fd3;
  case 0x95:
    aVar11 = this->literalArray[5].field_0;
    goto LAB_00145fd3;
  case 0x96:
    aVar11 = this->literalArray[6].field_0;
    goto LAB_00145fd3;
  case 0x97:
    aVar11 = this->literalArray[7].field_0;
    goto LAB_00145fd3;
  case 0x98:
    aVar11 = this->literalArray[8].field_0;
    goto LAB_00145fd3;
  case 0x99:
    aVar11 = this->literalArray[9].field_0;
    goto LAB_00145fd3;
  case 0x9a:
    aVar11 = this->literalArray[10].field_0;
    goto LAB_00145fd3;
  case 0x9b:
    aVar11 = this->literalArray[0xb].field_0;
    goto LAB_00145fd3;
  case 0x9c:
    aVar11 = this->literalArray[0xc].field_0;
    goto LAB_00145fd3;
  case 0x9d:
    aVar11 = this->literalArray[0xd].field_0;
    goto LAB_00145fd3;
  case 0x9e:
    aVar11 = this->literalArray[0xe].field_0;
    goto LAB_00145fd3;
  case 0x9f:
    aVar11 = this->literalArray[0xf].field_0;
LAB_00145fd3:
    sVar17 = 1;
    goto LAB_00145ffc;
  case 0xa0:
    aVar11 = this->literalArray->field_0;
    goto LAB_00145e7c;
  case 0xa1:
    aVar11 = this->literalArray[1].field_0;
    goto LAB_00145e7c;
  case 0xa2:
    aVar11 = this->literalArray[2].field_0;
    goto LAB_00145e7c;
  case 0xa3:
    aVar11 = this->literalArray[3].field_0;
    goto LAB_00145e7c;
  case 0xa4:
    aVar11 = this->literalArray[4].field_0;
    goto LAB_00145e7c;
  case 0xa5:
    aVar11 = this->literalArray[5].field_0;
    goto LAB_00145e7c;
  case 0xa6:
    aVar11 = this->literalArray[6].field_0;
    goto LAB_00145e7c;
  case 0xa7:
    aVar11 = this->literalArray[7].field_0;
    goto LAB_00145e7c;
  case 0xa8:
    aVar11 = this->literalArray[8].field_0;
    goto LAB_00145e7c;
  case 0xa9:
    aVar11 = this->literalArray[9].field_0;
    goto LAB_00145e7c;
  case 0xaa:
    aVar11 = this->literalArray[10].field_0;
    goto LAB_00145e7c;
  case 0xab:
    aVar11 = this->literalArray[0xb].field_0;
    goto LAB_00145e7c;
  case 0xac:
    aVar11 = this->literalArray[0xc].field_0;
    goto LAB_00145e7c;
  case 0xad:
    aVar11 = this->literalArray[0xd].field_0;
    goto LAB_00145e7c;
  case 0xae:
    aVar11 = this->literalArray[0xe].field_0;
    goto LAB_00145e7c;
  case 0xaf:
    aVar11 = this->literalArray[0xf].field_0;
LAB_00145e7c:
    sVar17 = 2;
    goto LAB_00145ffc;
  case 0xb0:
    this->pc = sVar17 + 2;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 1);
    goto LAB_00145f30;
  case 0xb1:
    this->pc = sVar17 + 3;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 2);
    goto LAB_00145f30;
  case 0xb2:
    this->pc = sVar17 + 4;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 3);
    goto LAB_00145f30;
  case 0xb3:
    this->pc = sVar17 + 5;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 4);
    goto LAB_00145f30;
  case 0xb4:
    this->pc = sVar17 + 6;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 5);
    goto LAB_00145f30;
  case 0xb5:
    this->pc = sVar17 + 7;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 6);
    goto LAB_00145f30;
  case 0xb6:
    this->pc = sVar17 + 8;
    uVar8 = (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17 + 7);
    goto LAB_00145f30;
  case 0xb7:
    this->pc = sVar17 + 9;
    uVar8 = (uint)*(byte *)((long)&this->method[1].super_ByteArray.super_ArrayedCollection.
                                   super_SequenceableCollection.super_Collection.super_Object.
                                   super_ProtoObject.object_header_ + sVar17);
LAB_00145f30:
    this->nextOpcode = uVar8;
    break;
  case 0xb8:
    iVar19 = 0;
    goto LAB_00145d86;
  case 0xb9:
    iVar19 = 1;
    goto LAB_00145d86;
  case 0xba:
    iVar19 = 2;
    goto LAB_00145d86;
  case 0xbb:
    iVar19 = 3;
    goto LAB_00145d86;
  case 0xbc:
    iVar19 = 4;
    goto LAB_00145d86;
  case 0xbd:
    iVar19 = 5;
    goto LAB_00145d86;
  case 0xbe:
    iVar19 = 6;
    goto LAB_00145d86;
  case 0xbf:
    iVar19 = 7;
LAB_00145d86:
    interpretJumpOnTrueShort(this,iVar19);
    break;
  case 0xc0:
    iVar19 = 0;
    goto LAB_00145d33;
  case 0xc1:
    iVar19 = 1;
    goto LAB_00145d33;
  case 0xc2:
    iVar19 = 2;
    goto LAB_00145d33;
  case 0xc3:
    iVar19 = 3;
    goto LAB_00145d33;
  case 0xc4:
    iVar19 = 4;
    goto LAB_00145d33;
  case 0xc5:
    iVar19 = 5;
    goto LAB_00145d33;
  case 0xc6:
    iVar19 = 6;
    goto LAB_00145d33;
  case 199:
    iVar19 = 7;
LAB_00145d33:
    interpretJumpOnFalseShort(this,iVar19);
    break;
  case 200:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    puVar15 = (undefined8 *)0x0;
    if ((uVar13 & 7) == 0) {
      puVar15 = (undefined8 *)(uVar13 + 8);
    }
    *puVar15 = uVar20;
    break;
  case 0xc9:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 8) = uVar20;
    break;
  case 0xca:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 0x10) = uVar20;
    break;
  case 0xcb:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 0x18) = uVar20;
    break;
  case 0xcc:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 0x20) = uVar20;
    break;
  case 0xcd:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 0x28) = uVar20;
    break;
  case 0xce:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 0x30) = uVar20;
    break;
  case 0xcf:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = *(ulong *)((pSVar14->stackFrame).framePointer + -0x20);
    lVar9 = 0;
    if ((uVar13 & 7) == 0) {
      lVar9 = uVar13 + 8;
    }
    *(undefined8 *)(lVar9 + 0x38) = uVar20;
    break;
  case 0xd0:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar12 = (pSVar14->stackFrame).framePointer;
    puVar10 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar10;
    (pSVar14->stackFrame).stackPointer = puVar10 + 8;
    sVar17 = this->argumentCount;
    puVar10 = puVar12 + 0x10;
    if (sVar17 == 0) {
      puVar10 = puVar12 + -0x28;
    }
    *(undefined8 *)(puVar10 + (sVar17 - (sVar17 != 0)) * 8) = uVar20;
    break;
  case 0xd1:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffe;
    lVar21 = 0x1fffffffffffffff;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 2;
    goto LAB_00145bfe;
  case 0xd2:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffd;
    lVar21 = 0x1ffffffffffffffe;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 3;
    goto LAB_00145bfe;
  case 0xd3:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffc;
    lVar21 = 0x1ffffffffffffffd;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 4;
    goto LAB_00145bfe;
  case 0xd4:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffb;
    lVar21 = 0x1ffffffffffffffc;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 5;
    goto LAB_00145bfe;
  case 0xd5:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffa;
    lVar21 = 0x1ffffffffffffffb;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 6;
LAB_00145bfe:
    if (bVar24) {
      puVar10 = puVar12;
      lVar9 = lVar21;
    }
    *(undefined8 *)(puVar10 + (lVar9 + uVar13) * 8) = uVar20;
    break;
  case 0xd6:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffffa;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 7;
    if (!bVar24) {
      lVar9 = 0x1ffffffffffffff9;
    }
    goto LAB_00145b88;
  case 0xd7:
    pSVar14 = this->stack;
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    puVar10 = (pSVar14->stackFrame).framePointer;
    puVar12 = (pSVar14->stackFrame).stackPointer;
    uVar20 = *(undefined8 *)puVar12;
    (pSVar14->stackFrame).stackPointer = puVar12 + 8;
    uVar13 = this->argumentCount;
    lVar9 = 0x1ffffffffffffff8;
    puVar12 = puVar10 + -0x28;
    puVar10 = puVar10 + 0x10;
    bVar24 = uVar13 < 8;
    if (bVar24) {
      lVar9 = 0x1ffffffffffffff9;
    }
LAB_00145b88:
    if (bVar24) {
      puVar10 = puVar12;
    }
    *(undefined8 *)(puVar10 + (lVar9 + uVar13) * 8) = uVar20;
    break;
  case 0xd8:
    this->pc = sVar17 + 1;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17);
    ppuVar1 = &(this->stack->stackFrame).stackPointer;
    *ppuVar1 = *ppuVar1 + 8;
    break;
  case 0xe0:
    pCVar16 = this->method;
    this->pc = sVar17 + 1;
    this->extendA =
         (ulong)*(byte *)((long)&(pCVar16->super_ByteArray).super_ArrayedCollection.
                                 super_SequenceableCollection.super_Collection.super_Object.
                                 super_ProtoObject.object_header_ + sVar17) | this->extendA << 8;
    goto LAB_00145831;
  case 0xe1:
    pCVar16 = this->method;
    this->pc = sVar17 + 1;
    this->extendB =
         (long)*(char *)((long)&(pCVar16->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17) + this->extendB * 0x100;
LAB_00145831:
    this->pc = sVar17 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(pCVar16->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17 + 1);
    sVar17 = sVar17 + 2;
    goto joined_r0x00144756;
  case 0xe2:
    uVar6 = this->extendA;
    this->pc = sVar17 + 1;
    bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                             super_SequenceableCollection.super_Collection.super_Object.
                             super_ProtoObject.object_header_ + sVar17);
    this->pc = sVar17 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17 + 1);
    this->extendA = 0;
    pushLongReceiverVariable(this,uVar6 << 8 | (ulong)bVar2);
    break;
  case 0xe3:
    this->pc = sVar17 + 1;
    bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                             super_SequenceableCollection.super_Collection.super_Object.
                             super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    uVar6 = this->extendA;
    this->pc = sVar17 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17 + 1);
    this->extendA = 0;
    aVar11 = *(anon_union_8_4_0eb573b0_for_Oop_0 *)
              (this->literalArray[(ulong)bVar2 + uVar6 * 0x100].field_0.uintValue + 0x10);
    goto LAB_00145a2a;
  case 0xe4:
    this->pc = sVar17 + 1;
    bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                             super_SequenceableCollection.super_Collection.super_Object.
                             super_ProtoObject.object_header_ + sVar17);
    pSVar14 = this->stack;
    uVar6 = this->extendA;
    this->pc = sVar17 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17 + 1);
    this->extendA = 0;
    aVar11 = this->literalArray[(ulong)bVar2 + uVar6 * 0x100].field_0;
LAB_00145a2a:
    puVar12 = (pSVar14->stackFrame).stackPointer;
    (pSVar14->stackFrame).stackPointer = puVar12 + -8;
    *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar12 + -8) = aVar11;
    break;
  case 0xe5:
    interpretPushTemporary(this);
    break;
  case 0xe6:
    interpretPushNTemps(this);
    break;
  case 0xe7:
    interpretPushInteger(this);
    break;
  case 0xe8:
    this->pc = sVar17 + 1;
    cVar3 = *(char *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                             super_SequenceableCollection.super_Collection.super_Object.
                             super_ProtoObject.object_header_ + sVar17);
    iVar7 = this->extendB;
    this->pc = sVar17 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17 + 1);
    this->extendB = 0;
    lVar9 = (long)((int)iVar7 * 0x800 + cVar3 * 8 + 2);
    pSVar14 = this->stack;
    puVar12 = (pSVar14->stackFrame).stackPointer;
LAB_001460cc:
    (pSVar14->stackFrame).stackPointer = puVar12 + -8;
    *(long *)(puVar12 + -8) = lVar9;
    break;
  case 0xe9:
    interpretPushArrayWithElements(this);
    break;
  case 0xea:
    interpretSend(this);
    break;
  case 0xeb:
    interpretSuperSend(this);
    break;
  case 0xed:
    interpretJump(this);
    break;
  case 0xee:
    interpretJumpOnTrue(this);
    break;
  case 0xef:
    interpretJumpOnFalse(this);
    break;
  case 0xf1:
    interpret();
  case 0xf0:
    interpret();
  case 0xec:
    interpret();
  case 0xf2:
    interpretPopStoreTemporalVariable(this);
    break;
  case 0xf3:
    interpretStoreReceiverVariable(this);
    break;
  case 0xf4:
    this->pc = sVar17 + 1;
    bVar2 = *(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                             super_SequenceableCollection.super_Collection.super_Object.
                             super_ProtoObject.object_header_ + sVar17);
    uVar6 = this->extendA;
    this->pc = sVar17 + 2;
    this->nextOpcode =
         (uint)*(byte *)((long)&(this->method->super_ByteArray).super_ArrayedCollection.
                                super_SequenceableCollection.super_Collection.super_Object.
                                super_ProtoObject.object_header_ + sVar17 + 1);
    this->extendA = 0;
    *(undefined8 *)(this->literalArray[(ulong)bVar2 + uVar6 * 0x100].field_0.uintValue + 0x10) =
         *(undefined8 *)(this->stack->stackFrame).stackPointer;
    break;
  case 0xf5:
    interpretStoreTemporalVariable(this);
    break;
  case 0xf8:
    interpretCallPrimitive(this);
    break;
  case 0xfa:
    interpretPushClosure(this);
    break;
  case 0xfb:
    interpretPushTemporaryInVector(this);
    break;
  case 0xfc:
    interpretStoreTemporalInVector(this);
    break;
  case 0xfd:
    interpretPopStoreTemporalInVector(this);
  }
  sVar17 = this->pc;
  goto joined_r0x00144756;
}

Assistant:

void StackInterpreter::interpret()
{
	// Reset the extensions values
	extendA = 0;
	extendB = 0;
    //printf("interpret begin %d\n", pc);
	while(pc != 0)
	{
		currentOpcode = nextOpcode;
        //printf("interpret %03d. %s\n", currentOpcode, getSistaBytecodeName(currentOpcode).c_str());
		switch(currentOpcode)
		{
#define BYTECODE_DISPATCH_NAME(name) interpret ## name
#include "BytecodeSetDispatchTable.inc"
#undef BYTECODE_DISPATCH_NAME

		default:
			errorFormat("unsupported bytecode %d", currentOpcode);
		}
	}
}